

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QPluginParsedMetaData>::Inserter::insertOne
          (Inserter *this,qsizetype pos,QPluginParsedMetaData *t)

{
  Type TVar1;
  QPluginParsedMetaData *pQVar2;
  QCborContainerPrivate *pQVar3;
  qsizetype i;
  long lVar4;
  long lVar5;
  
  setup(this,pos,1);
  pQVar2 = this->end;
  if (this->sourceCopyConstruct != 0) {
    (pQVar2->data).n = (t->data).n;
    pQVar3 = (t->data).container;
    (t->data).container = (QCborContainerPrivate *)0x0;
    (pQVar2->data).container = pQVar3;
    TVar1 = (t->data).t;
    (t->data).t = Undefined;
    (pQVar2->data).t = TVar1;
    this->size = this->size + 1;
    return;
  }
  pQVar3 = pQVar2[-1].data.container;
  (pQVar2->data).n = pQVar2[-1].data.n;
  (pQVar2->data).container = pQVar3;
  pQVar2[-1].data.container = (QCborContainerPrivate *)0x0;
  TVar1 = pQVar2[-1].data.t;
  pQVar2[-1].data.t = Undefined;
  (pQVar2->data).t = TVar1;
  this->size = this->size + 1;
  lVar5 = 0;
  for (lVar4 = 0; lVar4 != this->move; lVar4 = lVar4 + -1) {
    QCborValue::operator=
              ((QCborValue *)((long)&(this->last->data).n + lVar5),
               (QCborValue *)((long)&this->last[-1].data.n + lVar5));
    lVar5 = lVar5 + -0x18;
  }
  QCborValue::operator=((QCborValue *)this->where,&t->data);
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }